

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::io::anon_unknown_0::CodedStreamTest_InputOver2G_Test::TestBody
          (CodedStreamTest_InputOver2G_Test *this)

{
  bool bVar1;
  MockSpec<void_(absl::lts_20250127::LogSeverity,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  *this_00;
  TypedExpectation<void_(absl::lts_20250127::LogSeverity,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  *this_01;
  char *pcVar2;
  char *in_R9;
  AssertHelper local_300;
  Message local_2f8;
  int local_2ec;
  undefined1 local_2e8 [8];
  AssertionResult gtest_ar;
  AssertHelper local_2b8;
  Message local_2b0;
  bool local_2a1;
  undefined1 local_2a0 [8];
  AssertionResult gtest_ar__1;
  AssertHelper local_270;
  Message local_268;
  bool local_259;
  undefined1 local_258 [8];
  AssertionResult gtest_ar_;
  string str;
  CodedInputStream coded_input;
  Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_1d0;
  Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_1b8;
  Matcher<absl::lts_20250127::LogSeverity> local_1a0;
  MockSpec<void_(absl::lts_20250127::LogSeverity,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_188;
  undefined1 local_128 [8];
  ScopedMockLog log;
  ReallyBigInputStream input;
  CodedStreamTest_InputOver2G_Test *this_local;
  
  input.buffer_count_ = (int64_t)this;
  ReallyBigInputStream::ReallyBigInputStream((ReallyBigInputStream *)&log.is_capturing_logs_);
  absl::lts_20250127::ScopedMockLog::ScopedMockLog((ScopedMockLog *)local_128,kDisallowUnexpected);
  testing::Matcher<absl::lts_20250127::LogSeverity>::Matcher(&local_1a0,kError);
  testing::Matcher<std::__cxx11::string_const&>::
  Matcher<testing::internal::AnythingMatcher_const&,void>
            ((Matcher<std::__cxx11::string_const&> *)&local_1b8,(AnythingMatcher *)&testing::_);
  testing::Matcher<std::__cxx11::string_const&>::
  Matcher<testing::internal::AnythingMatcher_const&,void>
            ((Matcher<std::__cxx11::string_const&> *)&local_1d0,(AnythingMatcher *)&testing::_);
  absl::lts_20250127::ScopedMockLog::gmock_Log
            (&local_188,(ScopedMockLog *)local_128,&local_1a0,&local_1b8,&local_1d0);
  testing::internal::GetWithoutMatchers();
  this_00 = testing::internal::
            MockSpec<void_(absl::lts_20250127::LogSeverity,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
            ::operator()(&local_188,(WithoutMatchers *)((long)&coded_input.extension_factory_ + 7),
                         (void *)0x0);
  this_01 = testing::internal::
            MockSpec<void_(absl::lts_20250127::LogSeverity,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
            ::InternalExpectedAt
                      (this_00,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/coded_stream_unittest.cc"
                       ,0x63d,"log","Log(absl::LogSeverity::kError, testing::_, testing::_)");
  testing::internal::
  TypedExpectation<void_(absl::lts_20250127::LogSeverity,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::Times(this_01,0);
  testing::internal::
  MockSpec<void_(absl::lts_20250127::LogSeverity,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~MockSpec(&local_188);
  testing::
  Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>::
  ~Matcher(&local_1d0);
  testing::
  Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>::
  ~Matcher(&local_1b8);
  testing::Matcher<absl::lts_20250127::LogSeverity>::~Matcher(&local_1a0);
  absl::lts_20250127::ScopedMockLog::StartCapturingLogs((ScopedMockLog *)local_128);
  CodedInputStream::CodedInputStream
            ((CodedInputStream *)((long)&str.field_2 + 8),
             (ZeroCopyInputStream *)&log.is_capturing_logs_);
  std::__cxx11::string::string((string *)&gtest_ar_.message_);
  local_259 = CodedInputStream::ReadString
                        ((CodedInputStream *)((long)&str.field_2 + 8),(string *)&gtest_ar_.message_,
                         0x200);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_258,&local_259,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_258);
  if (!bVar1) {
    testing::Message::Message(&local_268);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__1.message_,(internal *)local_258,
               (AssertionResult *)"coded_input.ReadString(&str, 512)","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_270,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/coded_stream_unittest.cc"
               ,0x642,pcVar2);
    testing::internal::AssertHelper::operator=(&local_270,&local_268);
    testing::internal::AssertHelper::~AssertHelper(&local_270);
    std::__cxx11::string::~string((string *)&gtest_ar__1.message_);
    testing::Message::~Message(&local_268);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_258);
  local_2a1 = CodedInputStream::ReadString
                        ((CodedInputStream *)((long)&str.field_2 + 8),(string *)&gtest_ar_.message_,
                         0x400);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_2a0,&local_2a1,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2a0);
  if (!bVar1) {
    testing::Message::Message(&local_2b0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar.message_,(internal *)local_2a0,
               (AssertionResult *)"coded_input.ReadString(&str, 1024)","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_2b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/coded_stream_unittest.cc"
               ,0x643,pcVar2);
    testing::internal::AssertHelper::operator=(&local_2b8,&local_2b0);
    testing::internal::AssertHelper::~AssertHelper(&local_2b8);
    std::__cxx11::string::~string((string *)&gtest_ar.message_);
    testing::Message::~Message(&local_2b0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2a0);
  std::__cxx11::string::~string((string *)&gtest_ar_.message_);
  CodedInputStream::~CodedInputStream((CodedInputStream *)((long)&str.field_2 + 8));
  absl::lts_20250127::ScopedMockLog::~ScopedMockLog((ScopedMockLog *)local_128);
  local_2ec = 0x7ffffdff;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_2e8,"2147483647 - 512","input.backup_amount_",&local_2ec,
             (int *)&input);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2e8);
  if (!bVar1) {
    testing::Message::Message(&local_2f8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_2e8);
    testing::internal::AssertHelper::AssertHelper
              (&local_300,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/coded_stream_unittest.cc"
               ,0x646,pcVar2);
    testing::internal::AssertHelper::operator=(&local_300,&local_2f8);
    testing::internal::AssertHelper::~AssertHelper(&local_300);
    testing::Message::~Message(&local_2f8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2e8);
  ReallyBigInputStream::~ReallyBigInputStream((ReallyBigInputStream *)&log.is_capturing_logs_);
  return;
}

Assistant:

TEST_F(CodedStreamTest, InputOver2G) {
  // CodedInputStream should gracefully handle input over 2G and call
  // input.BackUp() with the correct number of bytes on destruction.
  ReallyBigInputStream input;

  {
    absl::ScopedMockLog log(absl::MockLogDefault::kDisallowUnexpected);
    EXPECT_CALL(log, Log(absl::LogSeverity::kError, testing::_, testing::_))
        .Times(0);
    log.StartCapturingLogs();
    CodedInputStream coded_input(&input);
    std::string str;
    EXPECT_TRUE(coded_input.ReadString(&str, 512));
    EXPECT_TRUE(coded_input.ReadString(&str, 1024));
  }

  EXPECT_EQ(INT_MAX - 512, input.backup_amount_);
}